

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Sphere::BasicIntersect
          (optional<pbrt::QuadricIntersection> *__return_storage_ptr__,Sphere *this,Ray *r,
          Float tMax)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Interval a;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Interval i;
  Interval a_00;
  Interval i_00;
  uint uVar14;
  Interval c_00;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Interval IVar22;
  Interval IVar23;
  undefined1 auVar24 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar25 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar36 [64];
  undefined1 auVar26 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar27 [16];
  undefined1 auVar39 [64];
  undefined1 auVar28 [16];
  undefined1 auVar40 [64];
  undefined1 auVar29 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  float fVar87;
  float fVar88;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  Vector3fi di;
  Point3fi oi;
  Interval b;
  Point3fi fp;
  Interval c;
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  undefined8 uStack_110;
  Point3fi local_f8;
  Point3fi local_d8;
  undefined1 local_b8 [16];
  Interval local_a0;
  Vector3<pbrt::Interval> local_98;
  Point3fi local_80;
  Interval local_68;
  Interval local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  
  fVar59 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar24._4_4_ = fVar59;
  auVar24._0_4_ = fVar59;
  auVar24._8_4_ = fVar59;
  auVar24._12_4_ = fVar59;
  fVar59 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar48._4_4_ = fVar59;
  auVar48._0_4_ = fVar59;
  auVar48._8_4_ = fVar59;
  auVar48._12_4_ = fVar59;
  fVar59 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar19._4_4_ = fVar59;
  auVar19._0_4_ = fVar59;
  auVar19._8_4_ = fVar59;
  auVar19._12_4_ = fVar59;
  local_f8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar24,auVar48);
  local_f8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar19);
  Transform::operator()(&local_d8,this->objectFromRender,&local_f8);
  fVar59 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar15._4_4_ = fVar59;
  auVar15._0_4_ = fVar59;
  auVar15._8_4_ = fVar59;
  auVar15._12_4_ = fVar59;
  fVar59 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar49._4_4_ = fVar59;
  auVar49._0_4_ = fVar59;
  auVar49._8_4_ = fVar59;
  auVar49._12_4_ = fVar59;
  fVar59 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar62._4_4_ = fVar59;
  auVar62._0_4_ = fVar59;
  auVar62._8_4_ = fVar59;
  auVar62._12_4_ = fVar59;
  local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar15,auVar49);
  local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar62);
  Transform::operator()((Vector3fi *)&local_f8,this->objectFromRender,(Vector3fi *)&local_80);
  IVar22 = local_f8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  auVar95._8_8_ = 0;
  auVar95._0_4_ =
       local_f8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  auVar95._4_4_ =
       local_f8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
  auVar21._8_4_ = 0x7fffffff;
  auVar21._0_8_ = 0x7fffffff7fffffff;
  auVar21._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx512vl(auVar95,auVar21);
  auVar24 = vshufps_avx(auVar15,auVar15,0xf5);
  auVar21 = vmaxss_avx(auVar15,auVar24);
  fVar59 = auVar21._0_4_;
  if ((0.0 < local_f8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low)
     || (auVar21 = vmovshdup_avx(auVar95), auVar21._0_4_ < 0.0)) {
    auVar21 = vminss_avx(auVar24,auVar15);
    fVar59 = fVar59 * fVar59;
    fVar60 = auVar21._0_4_ * auVar21._0_4_;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar60),ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar60 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar60);
    auVar21 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar59 < INFINITY) {
      auVar84._0_12_ = ZEXT812(0);
      auVar84._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar84,0);
      fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
      auVar21 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
    }
    auVar15 = ZEXT416((int)fVar60 + -1 + (uint)(fVar60 <= 0.0) * 2);
    auVar24 = vminss_avx(auVar21,auVar15);
    auVar21 = vmaxss_avx(auVar21,auVar15);
    auVar21 = vinsertps_avx(auVar24,auVar21,0x10);
    IVar23 = auVar21._0_8_;
  }
  else {
    uVar14 = 0x7f800000;
    fVar59 = fVar59 * fVar59;
    if (fVar59 < INFINITY) {
      auVar63._0_12_ = ZEXT812(0);
      auVar63._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar63,0);
      fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
      uVar14 = (-(uint)(fVar59 < 0.0) | 1) + (int)fVar59;
    }
    auVar64._4_4_ = uVar14;
    auVar64._0_4_ = uVar14;
    auVar64._8_4_ = uVar14;
    auVar64._12_4_ = uVar14;
    auVar21 = vblendps_avx(auVar64,ZEXT816(0),0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar14),auVar21,1);
    IVar23.high = (Float)(((byte)(uVar1 >> 1) & 1) * uVar14);
    IVar23.low = (Float)(((byte)uVar1 & 1) * uVar14);
  }
  auVar30._0_8_ =
       FMA(local_f8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,
           local_f8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,IVar23
          );
  auVar30._8_56_ = extraout_var_05;
  auVar21 = vmaxss_avx(auVar30._0_16_,ZEXT816(0) << 0x40);
  auVar15 = vmovshdup_avx(auVar30._0_16_);
  auVar24 = vminss_avx(auVar15,auVar21);
  auVar21 = vmaxss_avx(auVar15,auVar21);
  auVar21 = vinsertps_avx(auVar24,auVar21,0x10);
  IVar22 = FMA(IVar22,IVar22,auVar21._0_8_);
  local_128._8_8_ = extraout_XMM0_Qb;
  local_128._0_4_ = IVar22.low;
  local_128._4_4_ = IVar22.high;
  IVar22.high = local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
  IVar22.low = local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
               low;
  IVar22 = Interval::operator*((Interval *)&local_f8,IVar22);
  i.high = local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  i.low = local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  IVar23 = Interval::operator*(&local_f8.super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,i);
  local_118._0_4_ = IVar22.low;
  local_118._4_4_ = IVar22.high;
  uStack_110._0_4_ = (float)extraout_XMM0_Qb_00;
  uStack_110._4_4_ = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  auVar21 = SUB6416(ZEXT464(0xff800000),0);
  fVar59 = (float)local_118._0_4_ + IVar23.low;
  if (-INFINITY < fVar59) {
    auVar50._0_12_ = ZEXT812(0);
    auVar50._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar50,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar59);
    auVar21 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
  }
  auVar15 = SUB6416(ZEXT464(0x7f800000),0);
  auVar25._0_4_ = (float)local_118._0_4_ + IVar23.low;
  auVar25._4_4_ = (float)local_118._4_4_ + IVar23.high;
  auVar25._8_4_ = (float)uStack_110 + (float)extraout_XMM0_Qb_01;
  auVar25._12_4_ = uStack_110._4_4_ + (float)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  auVar24 = vmovshdup_avx(auVar25);
  if (auVar24._0_4_ < INFINITY) {
    auVar65._0_12_ = ZEXT812(0);
    auVar65._12_4_ = 0;
    uVar3 = vcmpss_avx512f(auVar24,auVar65,0);
    fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)auVar24._0_4_);
    auVar15 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
  }
  auVar24 = vminss_avx(auVar15,auVar21);
  local_b8._0_4_ = auVar24._0_4_;
  auVar21 = vmaxss_avx(auVar15,auVar21);
  i_00.high = local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              high;
  i_00.low = local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  auVar31._0_8_ =
       Interval::operator*(&local_f8.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z,i_00);
  auVar31._8_56_ = extraout_var_06;
  fVar59 = auVar31._0_4_ + (float)local_b8._0_4_;
  auVar24 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < fVar59) {
    auVar51._0_12_ = ZEXT812(0);
    auVar51._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar51,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar59);
    auVar24 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
  }
  auVar15 = vmovshdup_avx(auVar31._0_16_);
  fVar59 = auVar15._0_4_ + auVar21._0_4_;
  auVar21 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar59 < INFINITY) {
    auVar66._0_12_ = ZEXT812(0);
    auVar66._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar66,0);
    fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
    auVar21 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
  }
  auVar15 = vminss_avx(auVar21,auVar24);
  auVar21 = vmaxss_avx(auVar21,auVar24);
  auVar67._8_4_ = 0x40000000;
  auVar67._0_8_ = 0x4000000040000000;
  auVar67._12_4_ = 0x40000000;
  auVar21 = vinsertps_avx(auVar15,auVar21,0x10);
  IVar22 = (Interval)vmovlps_avx(auVar67);
  local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = IVar22;
  auVar32._0_8_ = Interval::operator*((Interval *)&local_80,auVar21._0_8_);
  auVar32._8_56_ = extraout_var_07;
  local_a0 = (Interval)vmovlps_avx(auVar32._0_16_);
  a.high = local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  a.low = local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar96._4_4_ =
       local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
  auVar96._0_4_ =
       local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  auVar96._8_8_ = 0;
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx512vl(auVar96,auVar5);
  a_00.high = local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
              high;
  a_00.low = local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar24 = vshufps_avx(auVar15,auVar15,0xf5);
  auVar21 = vmaxss_avx(auVar15,auVar24);
  fVar59 = auVar21._0_4_;
  if ((0.0 < local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low)
     || (auVar21 = vmovshdup_avx(auVar96), auVar21._0_4_ < 0.0)) {
    auVar21 = vminss_avx(auVar24,auVar15);
    fVar59 = fVar59 * fVar59;
    fVar60 = auVar21._0_4_ * auVar21._0_4_;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar60),ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar60 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar60);
    auVar21 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar59 < INFINITY) {
      auVar85._0_12_ = ZEXT812(0);
      auVar85._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar85,0);
      fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
      auVar21 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
    }
    auVar15 = ZEXT416((int)fVar60 + -1 + (uint)(fVar60 <= 0.0) * 2);
    auVar24 = vminss_avx(auVar21,auVar15);
    auVar21 = vmaxss_avx(auVar21,auVar15);
    auVar21 = vinsertps_avx(auVar24,auVar21,0x10);
    c_00 = auVar21._0_8_;
  }
  else {
    uVar14 = 0x7f800000;
    fVar59 = fVar59 * fVar59;
    if (fVar59 < INFINITY) {
      auVar68._0_12_ = ZEXT812(0);
      auVar68._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar68,0);
      fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
      uVar14 = (-(uint)(fVar59 < 0.0) | 1) + (int)fVar59;
    }
    auVar69._4_4_ = uVar14;
    auVar69._0_4_ = uVar14;
    auVar69._8_4_ = uVar14;
    auVar69._12_4_ = uVar14;
    auVar21 = vblendps_avx(auVar69,ZEXT816(0),0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar14),auVar21,1);
    c_00.high = (Float)(((byte)(uVar1 >> 1) & 1) * uVar14);
    c_00.low = (Float)(((byte)uVar1 & 1) * uVar14);
  }
  auVar21 = vmaxss_avx(local_128,ZEXT416(0));
  auVar15 = vmovshdup_avx(local_128);
  local_b8._0_4_ = auVar21._0_4_;
  auVar33._0_8_ = FMA(a_00,a_00,c_00);
  auVar33._8_56_ = extraout_var_08;
  auVar21 = vmaxss_avx(auVar33._0_16_,ZEXT816(0) << 0x40);
  auVar48 = vmovshdup_avx(auVar33._0_16_);
  auVar24 = vminss_avx(auVar48,auVar21);
  auVar21 = vmaxss_avx(auVar48,auVar21);
  auVar21 = vinsertps_avx(auVar24,auVar21,0x10);
  auVar34._0_8_ = FMA(a,a,auVar21._0_8_);
  auVar34._8_56_ = extraout_var_09;
  fVar59 = this->radius;
  auVar48 = vmovshdup_avx(auVar34._0_16_);
  auVar21 = vmaxss_avx(auVar34._0_16_,ZEXT816(0) << 0x40);
  auVar24 = vminss_avx(auVar48,auVar21);
  fVar60 = fVar59 * fVar59;
  auVar49 = ZEXT416((uint)fVar60);
  if ((fVar59 != 0.0) || (NAN(fVar59))) {
    uVar3 = vcmpss_avx512f(auVar49,ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar60);
    auVar19 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar60 < INFINITY) {
      auVar97._0_12_ = ZEXT812(0);
      auVar97._12_4_ = 0;
      uVar3 = vcmpss_avx512f(auVar49,auVar97,0);
      fVar60 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar60);
      auVar19 = ZEXT416((-(uint)(fVar60 < 0.0) | 1) + (int)fVar60);
    }
    auVar49 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
    auVar62 = vminss_avx(auVar19,auVar49);
    auVar49 = vmaxss_avx(auVar19,auVar49);
    auVar16 = vinsertps_avx(auVar62,auVar49,0x10);
  }
  else {
    uVar14 = 0x7f800000;
    if (fVar60 < INFINITY) {
      auVar90._0_12_ = ZEXT812(0);
      auVar90._12_4_ = 0;
      uVar3 = vcmpss_avx512f(auVar49,auVar90,0);
      uVar14 = (uint)!(bool)((byte)uVar3 & 1) * (int)fVar60 + 1;
    }
    auVar91._4_4_ = uVar14;
    auVar91._0_4_ = uVar14;
    auVar91._8_4_ = uVar14;
    auVar91._12_4_ = uVar14;
    auVar11._12_4_ = 0;
    auVar11._0_12_ = ZEXT812(0);
    auVar49 = vblendps_avx(auVar91,auVar11 << 0x20,0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar14),auVar49,1);
    auVar16._4_4_ = ((byte)(uVar1 >> 1) & 1) * uVar14;
    auVar16._0_4_ = ((byte)uVar1 & 1) * uVar14;
    auVar16._8_4_ = ((byte)(uVar1 >> 2) & 1) * uVar14;
    auVar16._12_4_ = ((byte)(uVar1 >> 3) & 1) * uVar14;
  }
  auVar21 = vmaxss_avx(auVar48,auVar21);
  auVar48 = vmovshdup_avx(auVar16);
  fVar59 = auVar24._0_4_ - auVar48._0_4_;
  auVar48 = vminss_avx(auVar15,ZEXT416((uint)local_b8._0_4_));
  auVar24 = vmaxss_avx(auVar15,ZEXT416((uint)local_b8._0_4_));
  auVar15 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < fVar59) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),ZEXT816(0) << 0x20,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar59);
    auVar15 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
  }
  auVar49 = SUB6416(ZEXT464(0x7f800000),0);
  fVar59 = auVar21._0_4_ - auVar16._0_4_;
  local_b8 = vinsertps_avx(auVar48,auVar24,0x10);
  if (fVar59 < INFINITY) {
    auVar70._0_12_ = ZEXT812(0);
    auVar70._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar70,0);
    fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
    auVar49 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
  }
  auVar24 = vminss_avx(auVar49,auVar15);
  auVar21 = vmaxss_avx(auVar49,auVar15);
  auVar21 = vinsertps_avx(auVar24,auVar21,0x10);
  auVar71._8_4_ = 0x40000000;
  auVar71._0_8_ = 0x4000000040000000;
  auVar71._12_4_ = 0x40000000;
  local_60 = (Interval)vmovlps_avx(auVar21);
  local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       (Interval)vmovlps_avx(auVar71);
  IVar22 = Interval::operator*((Interval *)&local_80,local_b8._0_8_);
  auVar35._0_8_ = Interval::operator/(&local_a0,IVar22);
  auVar35._8_56_ = extraout_var_10;
  local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       (Interval)vmovlps_avx(auVar35._0_16_);
  IVar22 = Interval::operator*((Interval *)&local_80,
                               local_f8.super_Point3<pbrt::Interval>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x);
  local_128._8_8_ = extraout_XMM0_Qb_02;
  local_128._0_4_ = IVar22.low;
  local_128._4_4_ = IVar22.high;
  IVar22 = Interval::operator*((Interval *)&local_80,
                               local_f8.super_Point3<pbrt::Interval>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
  uStack_110 = extraout_XMM0_Qb_03;
  local_118._0_4_ = IVar22.low;
  local_118._4_4_ = IVar22.high;
  auVar36._0_8_ =
       Interval::operator*((Interval *)&local_80,
                           local_f8.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z);
  auVar36._8_56_ = extraout_var_11;
  local_98.super_Tuple3<pbrt::Vector3,_pbrt::Interval>._0_16_ = vunpcklpd_avx(local_128,_local_118);
  local_98.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z = (Interval)vmovlps_avx(auVar36._0_16_);
  Point3fi::operator-(&local_80,&local_d8,&local_98);
  auVar92._8_8_ = 0;
  auVar92._0_4_ =
       local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar92._4_4_ =
       local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx512vl(auVar92,auVar6);
  auVar24 = vshufps_avx(auVar15,auVar15,0xf5);
  auVar21 = vmaxss_avx(auVar15,auVar24);
  fVar59 = auVar21._0_4_;
  if ((0.0 < local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low)
     || (auVar21 = vmovshdup_avx(auVar92), auVar21._0_4_ < 0.0)) {
    auVar21 = vminss_avx(auVar24,auVar15);
    fVar59 = fVar59 * fVar59;
    fVar60 = auVar21._0_4_ * auVar21._0_4_;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar60),ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar60 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar60);
    auVar21 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar59 < INFINITY) {
      auVar72._0_12_ = ZEXT812(0);
      auVar72._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar72,0);
      fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
      auVar21 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
    }
    auVar15 = ZEXT416((int)fVar60 + -1 + (uint)(fVar60 <= 0.0) * 2);
    auVar24 = vminss_avx(auVar21,auVar15);
    auVar21 = vmaxss_avx(auVar21,auVar15);
    auVar17 = vinsertps_avx(auVar24,auVar21,0x10);
  }
  else {
    uVar14 = 0x7f800000;
    fVar59 = fVar59 * fVar59;
    if (fVar59 < INFINITY) {
      auVar52._0_12_ = ZEXT812(0);
      auVar52._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar52,0);
      fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
      uVar14 = (-(uint)(fVar59 < 0.0) | 1) + (int)fVar59;
    }
    auVar53._4_4_ = uVar14;
    auVar53._0_4_ = uVar14;
    auVar53._8_4_ = uVar14;
    auVar53._12_4_ = uVar14;
    auVar21 = vblendps_avx(auVar53,ZEXT816(0),0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar14),auVar21,1);
    auVar17._4_4_ = ((byte)(uVar1 >> 1) & 1) * uVar14;
    auVar17._0_4_ = ((byte)uVar1 & 1) * uVar14;
    auVar17._8_4_ = ((byte)(uVar1 >> 2) & 1) * uVar14;
    auVar17._12_4_ = ((byte)(uVar1 >> 3) & 1) * uVar14;
  }
  auVar98._8_8_ = 0;
  auVar98._0_4_ =
       local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar98._4_4_ =
       local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx512vl(auVar98,auVar7);
  auVar24 = vshufps_avx(auVar15,auVar15,0xf5);
  auVar21 = vmaxss_avx(auVar15,auVar24);
  fVar59 = auVar21._0_4_;
  if ((0.0 < local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low)
     || (auVar21 = vmovshdup_avx(auVar98), auVar21._0_4_ < 0.0)) {
    auVar21 = vminss_avx(auVar24,auVar15);
    fVar59 = fVar59 * fVar59;
    fVar60 = auVar21._0_4_ * auVar21._0_4_;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar60),ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar60 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar60);
    auVar21 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar59 < INFINITY) {
      auVar86._0_12_ = ZEXT812(0);
      auVar86._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar86,0);
      fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
      auVar21 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
    }
    auVar15 = ZEXT416((int)fVar60 + -1 + (uint)(fVar60 <= 0.0) * 2);
    auVar24 = vminss_avx(auVar21,auVar15);
    auVar21 = vmaxss_avx(auVar21,auVar15);
    auVar18 = vinsertps_avx(auVar24,auVar21,0x10);
  }
  else {
    uVar14 = 0x7f800000;
    fVar59 = fVar59 * fVar59;
    if (fVar59 < INFINITY) {
      auVar73._0_12_ = ZEXT812(0);
      auVar73._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar73,0);
      fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
      uVar14 = (-(uint)(fVar59 < 0.0) | 1) + (int)fVar59;
    }
    auVar74._4_4_ = uVar14;
    auVar74._0_4_ = uVar14;
    auVar74._8_4_ = uVar14;
    auVar74._12_4_ = uVar14;
    auVar21 = vblendps_avx(auVar74,ZEXT816(0),0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar14),auVar21,1);
    auVar18._4_4_ = ((byte)(uVar1 >> 1) & 1) * uVar14;
    auVar18._0_4_ = ((byte)uVar1 & 1) * uVar14;
    auVar18._8_4_ = ((byte)(uVar1 >> 2) & 1) * uVar14;
    auVar18._12_4_ = ((byte)(uVar1 >> 3) & 1) * uVar14;
  }
  auVar21 = SUB6416(ZEXT464(0xff800000),0);
  fVar59 = auVar17._0_4_ + auVar18._0_4_;
  if (-INFINITY < fVar59) {
    auVar26._0_12_ = ZEXT812(0);
    auVar26._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar26,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar59);
    auVar21 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
  }
  auVar54._0_4_ = auVar17._0_4_ + auVar18._0_4_;
  auVar54._4_4_ = auVar17._4_4_ + auVar18._4_4_;
  auVar54._8_4_ = auVar17._8_4_ + auVar18._8_4_;
  auVar54._12_4_ = auVar17._12_4_ + auVar18._12_4_;
  auVar24 = vmovshdup_avx(auVar54);
  auVar15 = SUB6416(ZEXT464(0x7f800000),0);
  if (auVar24._0_4_ < INFINITY) {
    auVar55._0_12_ = ZEXT812(0);
    auVar55._12_4_ = 0;
    uVar3 = vcmpss_avx512f(auVar24,auVar55,0);
    fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)auVar24._0_4_);
    auVar15 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
  }
  auVar100._8_8_ = 0;
  auVar100._0_4_ =
       local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  auVar100._4_4_ =
       local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
  auVar48 = vminss_avx(auVar15,auVar21);
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar19 = vandps_avx512vl(auVar100,auVar8);
  auVar49 = vshufps_avx(auVar19,auVar19,0xf5);
  auVar24 = vmaxss_avx(auVar19,auVar49);
  fVar59 = auVar24._0_4_;
  if ((0.0 < local_80.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low)
     || (auVar24 = vmovshdup_avx(auVar100), auVar24._0_4_ < 0.0)) {
    auVar24 = vminss_avx(auVar49,auVar19);
    fVar59 = fVar59 * fVar59;
    fVar60 = auVar24._0_4_ * auVar24._0_4_;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar60),ZEXT816(0) << 0x20,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar60 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar60);
    auVar24 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar59 < INFINITY) {
      auVar99._0_12_ = ZEXT812(0);
      auVar99._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar99,0);
      fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
      auVar24 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
    }
    auVar19 = ZEXT416((int)fVar60 + -1 + (uint)(fVar60 <= 0.0) * 2);
    auVar49 = vminss_avx(auVar24,auVar19);
    auVar24 = vmaxss_avx(auVar24,auVar19);
    auVar20 = vinsertps_avx(auVar49,auVar24,0x10);
  }
  else {
    uVar14 = 0x7f800000;
    fVar59 = fVar59 * fVar59;
    if (fVar59 < INFINITY) {
      auVar93._0_12_ = ZEXT812(0);
      auVar93._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar93,0);
      fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
      uVar14 = (-(uint)(fVar59 < 0.0) | 1) + (int)fVar59;
    }
    auVar94._4_4_ = uVar14;
    auVar94._0_4_ = uVar14;
    auVar94._8_4_ = uVar14;
    auVar94._12_4_ = uVar14;
    auVar24 = vblendps_avx(auVar94,ZEXT816(0),0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar14),auVar24,1);
    auVar20._4_4_ = ((byte)(uVar1 >> 1) & 1) * uVar14;
    auVar20._0_4_ = ((byte)uVar1 & 1) * uVar14;
    auVar20._8_4_ = ((byte)(uVar1 >> 2) & 1) * uVar14;
    auVar20._12_4_ = ((byte)(uVar1 >> 3) & 1) * uVar14;
  }
  auVar21 = vmaxss_avx(auVar15,auVar21);
  fVar59 = auVar48._0_4_ + auVar20._0_4_;
  auVar24 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < fVar59) {
    auVar75._0_12_ = ZEXT812(0);
    auVar75._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar75,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar59);
    auVar24 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
  }
  auVar15 = vmovshdup_avx(auVar20);
  auVar48 = SUB6416(ZEXT464(0x7f800000),0);
  fVar59 = auVar21._0_4_ + auVar15._0_4_;
  if (fVar59 < INFINITY) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),ZEXT816(0) << 0x20,0);
    fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
    auVar48 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
  }
  auVar21 = vminss_avx(auVar48,auVar24);
  if (auVar21._0_4_ < 0.0) {
    auVar37._0_4_ = sqrtf(auVar21._0_4_);
    auVar37._4_60_ = extraout_var;
    auVar48 = ZEXT416(auVar48._0_4_);
    auVar24 = ZEXT416(auVar24._0_4_);
    auVar21 = auVar37._0_16_;
  }
  else {
    auVar21 = vsqrtss_avx(auVar21,auVar21);
  }
  auVar24 = vmaxss_avx(auVar48,auVar24);
  auVar15 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < auVar21._0_4_) {
    uVar3 = vcmpss_avx512f(auVar21,ZEXT416(0) << 0x20,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)auVar21._0_4_);
    auVar15 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
  }
  if (auVar24._0_4_ < 0.0) {
    auVar38._0_4_ = sqrtf(auVar24._0_4_);
    auVar38._4_60_ = extraout_var_00;
    auVar21 = auVar38._0_16_;
    auVar15 = ZEXT416(auVar15._0_4_);
  }
  else {
    auVar21 = vsqrtss_avx(auVar24,auVar24);
  }
  auVar24 = SUB6416(ZEXT464(0x7f800000),0);
  if (auVar21._0_4_ < INFINITY) {
    auVar56._0_12_ = ZEXT812(0);
    auVar56._12_4_ = 0;
    uVar3 = vcmpss_avx512f(auVar21,auVar56,0);
    fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)auVar21._0_4_);
    auVar24 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
  }
  auVar21 = vmaxss_avx(auVar15,ZEXT816(0) << 0x40);
  auVar15 = vminss_avx(auVar24,auVar21);
  auVar21 = vmaxss_avx(auVar24,auVar21);
  auVar27._8_4_ = 0x40800000;
  auVar27._0_8_ = 0x4080000040800000;
  auVar27._12_4_ = 0x40800000;
  local_98.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar27);
  auVar39._0_8_ = Interval::operator*((Interval *)&local_98,(Interval)local_b8._0_8_);
  auVar39._8_56_ = extraout_var_12;
  local_68 = (Interval)vmovlps_avx(auVar39._0_16_);
  auVar24 = SUB6416(ZEXT464(0xff800000),0);
  fVar59 = this->radius + auVar15._0_4_;
  if (-INFINITY < fVar59) {
    auVar28._0_12_ = ZEXT812(0);
    auVar28._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar28,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar59);
    auVar24 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
  }
  fVar59 = this->radius + auVar21._0_4_;
  auVar48 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar59 < INFINITY) {
    auVar76._0_12_ = ZEXT812(0);
    auVar76._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar76,0);
    fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
    auVar48 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
  }
  auVar49 = vminss_avx(auVar48,auVar24);
  auVar24 = vmaxss_avx(auVar48,auVar24);
  auVar24 = vinsertps_avx(auVar49,auVar24,0x10);
  auVar40._0_8_ = Interval::operator*(&local_68,auVar24._0_8_);
  auVar40._8_56_ = extraout_var_13;
  uVar3 = vmovlps_avx(auVar40._0_16_);
  local_98.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low = (Float)(int)uVar3;
  local_98.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high = (Float)(int)((ulong)uVar3 >> 0x20);
  auVar24 = SUB6416(ZEXT464(0xff800000),0);
  fVar59 = this->radius - auVar21._0_4_;
  if (-INFINITY < fVar59) {
    auVar29._0_12_ = ZEXT812(0);
    auVar29._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar29,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar59);
    auVar24 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
  }
  fVar59 = this->radius - auVar15._0_4_;
  auVar21 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar59 < INFINITY) {
    auVar77._0_12_ = ZEXT812(0);
    auVar77._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar77,0);
    fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
    auVar21 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
  }
  auVar15 = vminss_avx(auVar21,auVar24);
  auVar21 = vmaxss_avx(auVar21,auVar24);
  auVar21 = vinsertps_avx(auVar15,auVar21,0x10);
  auVar41._0_8_ = Interval::operator*((Interval *)&local_98,auVar21._0_8_);
  auVar41._8_56_ = extraout_var_14;
  auVar21 = auVar41._0_16_;
  fVar59 = auVar41._0_4_;
  if (0.0 <= fVar59) {
    if (fVar59 < 0.0) {
      auVar42._0_4_ = sqrtf(fVar59);
      auVar42._4_60_ = extraout_var_01;
      auVar24 = auVar42._0_16_;
    }
    else {
      auVar24 = vsqrtss_avx(auVar21,auVar21);
    }
    auVar15 = SUB6416(ZEXT464(0xff800000),0);
    if (-INFINITY < auVar24._0_4_) {
      uVar3 = vcmpss_avx512f(auVar24,ZEXT816(0) << 0x40,0);
      bVar4 = (bool)((byte)uVar3 & 1);
      fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)auVar24._0_4_);
      auVar15 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
    }
    auVar21 = vmovshdup_avx(auVar21);
    if (auVar21._0_4_ < 0.0) {
      auVar43._0_4_ = sqrtf(auVar21._0_4_);
      auVar43._4_60_ = extraout_var_02;
      auVar21 = auVar43._0_16_;
      auVar15 = ZEXT416(auVar15._0_4_);
    }
    else {
      auVar21 = vsqrtss_avx(auVar21,auVar21);
    }
    auVar24 = SUB6416(ZEXT464(0x7f800000),0);
    if (auVar21._0_4_ < INFINITY) {
      uVar3 = vcmpss_avx512f(auVar21,ZEXT816(0) << 0x40,0);
      fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)auVar21._0_4_);
      auVar24 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
    }
    auVar21 = vmaxss_avx(auVar15,ZEXT816(0) << 0x40);
    auVar15 = vminss_avx(auVar24,auVar21);
    auVar21 = vmaxss_avx(auVar24,auVar21);
    if (0.0 <= (local_a0.low + local_a0.high) * 0.5) {
      fVar59 = auVar15._0_4_ + local_a0.low;
      auVar24 = SUB6416(ZEXT464(0xff800000),0);
      if (-INFINITY < fVar59) {
        auVar58._0_12_ = ZEXT812(0);
        auVar58._12_4_ = 0;
        uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar58,0);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar59);
        auVar24 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
      }
      fVar59 = auVar21._0_4_ + local_a0.high;
      auVar21 = SUB6416(ZEXT464(0x7f800000),0);
      if (fVar59 < INFINITY) {
        auVar79._0_12_ = ZEXT812(0);
        auVar79._12_4_ = 0;
        uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar79,0);
        fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
        auVar21 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
      }
      auVar15 = vminss_avx(auVar21,auVar24);
      auVar21 = vmaxss_avx(auVar21,auVar24);
    }
    else {
      fVar59 = local_a0.low - auVar21._0_4_;
      auVar21 = SUB6416(ZEXT464(0xff800000),0);
      if (-INFINITY < fVar59) {
        auVar78._0_12_ = ZEXT812(0);
        auVar78._12_4_ = 0;
        uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar78,0);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar59 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar59);
        auVar21 = ZEXT416((int)fVar59 + -1 + (uint)(fVar59 <= 0.0) * 2);
      }
      fVar59 = local_a0.high - auVar15._0_4_;
      auVar24 = SUB6416(ZEXT464(0x7f800000),0);
      if (fVar59 < INFINITY) {
        auVar57._0_12_ = ZEXT812(0);
        auVar57._12_4_ = 0;
        uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar59),auVar57,0);
        fVar59 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar59);
        auVar24 = ZEXT416((-(uint)(fVar59 < 0.0) | 1) + (int)fVar59);
      }
      auVar15 = vminss_avx(auVar24,auVar21);
      auVar21 = vmaxss_avx(auVar24,auVar21);
    }
    auVar80._8_4_ = 0xbf000000;
    auVar80._0_8_ = 0xbf000000bf000000;
    auVar80._12_4_ = 0xbf000000;
    auVar21 = vinsertps_avx(auVar15,auVar21,0x10);
    local_98.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar80);
    auVar44._0_8_ = Interval::operator*((Interval *)&local_98,auVar21._0_8_);
    auVar44._8_56_ = extraout_var_15;
    uVar3 = vmovlps_avx(auVar44._0_16_);
    local_98.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low = (Float)(int)uVar3;
    local_98.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high = (Float)(int)((ulong)uVar3 >> 0x20)
    ;
    IVar22 = Interval::operator/((Interval *)&local_98,(Interval)local_b8._0_8_);
    local_128._8_8_ = extraout_XMM0_Qb_04;
    local_128._0_4_ = IVar22.low;
    local_128._4_4_ = IVar22.high;
    auVar45._0_8_ =
         Interval::operator/(&local_60,local_98.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x);
    auVar45._8_56_ = extraout_var_16;
    auVar21 = auVar45._0_16_;
    local_b8 = local_128;
    if (IVar22.low <= auVar45._0_4_) {
      local_b8 = auVar21;
      auVar21 = local_128;
    }
    local_28 = vmovshdup_avx(auVar21);
    if (((tMax < local_28._0_4_) || (local_b8._0_4_ <= 0.0)) ||
       ((local_38 = vmovshdup_avx(local_b8), auVar21._0_4_ <= 0.0 &&
        (local_28 = local_38, auVar21 = local_b8, tMax < local_38._0_4_)))) goto LAB_00304394;
    fVar61 = auVar21._0_4_;
    auVar12._4_4_ =
         local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    auVar12._0_4_ =
         local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    auVar12._8_4_ =
         local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    auVar12._12_4_ =
         local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar21 = vinsertps_avx(auVar12,ZEXT416((uint)local_d8.super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
                            ,0x10);
    auVar24 = vinsertps_avx((undefined1  [16])
                            local_f8.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                            ZEXT416((uint)local_f8.super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    fVar60 = (fVar61 + local_28._0_4_) * 0.5;
    local_48 = ZEXT416((uint)fVar60);
    fVar59 = (local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
             + local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
               high) * 0.5 +
             fVar60 * (local_f8.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                      local_f8.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    fVar83 = (local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              high + auVar21._0_4_) * 0.5 +
             fVar60 * (local_f8.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high + auVar24._0_4_) * 0.5;
    fVar87 = (local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
             + auVar21._4_4_) * 0.5 +
             fVar60 * (local_f8.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low + auVar24._4_4_) * 0.5;
    fVar88 = (auVar21._8_4_ + 0.0) * 0.5 + fVar60 * (auVar24._8_4_ + 0.0) * 0.5;
    fVar89 = (auVar21._12_4_ + 0.0) * 0.5 + fVar60 * (auVar24._12_4_ + 0.0) * 0.5;
    auVar81._0_4_ = fVar83 * fVar83;
    auVar81._4_4_ = fVar87 * fVar87;
    auVar81._8_4_ = fVar88 * fVar88;
    auVar81._12_4_ = fVar89 * fVar89;
    auVar21 = vhaddps_avx(auVar81,auVar81);
    auVar21 = ZEXT416((uint)(auVar21._0_4_ + fVar59 * fVar59));
    auVar21 = vsqrtss_avx(auVar21,auVar21);
    fVar60 = this->radius / auVar21._0_4_;
    local_58._0_4_ = fVar83 * fVar60;
    local_58._4_4_ = fVar87 * fVar60;
    local_58._8_4_ = fVar88 * fVar60;
    local_58._12_4_ = fVar89 * fVar60;
    uVar1 = vcmpps_avx512vl(local_58,ZEXT416(0) << 0x20,0);
    auVar21 = vmovshdup_avx(local_58);
    uVar2 = vcmpps_avx512vl(auVar21,ZEXT416(0) << 0x20,0);
    if ((uVar1 & uVar2 & 1) != 0) {
      local_58._4_12_ = local_58._4_12_;
      local_58._0_4_ = this->radius * 1e-05;
    }
    fVar59 = fVar59 * fVar60;
    auVar21 = vmovshdup_avx(local_58);
    auVar46._0_4_ = atan2f(auVar21._0_4_,local_58._0_4_);
    auVar46._4_60_ = extraout_var_03;
    fVar60 = this->radius;
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar21 = vxorps_avx512vl(ZEXT416((uint)fVar60),auVar9);
    if ((this->zMin <= auVar21._0_4_) || (this->zMin <= fVar59)) {
      uVar1 = vcmpps_avx512vl(ZEXT416((uint)this->zMax),ZEXT416((uint)fVar60),1);
      uVar2 = vcmpps_avx512vl(ZEXT416((uint)this->zMax),ZEXT416((uint)fVar59),1);
      if ((uVar1 & uVar2 & 1) == 0) {
        uVar3 = vcmpss_avx512f(auVar46._0_16_,ZEXT816(0) << 0x20,1);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar83 = (float)((uint)bVar4 * (int)(auVar46._0_4_ + 6.2831855) +
                        (uint)!bVar4 * (int)auVar46._0_4_);
        if (fVar83 <= this->phiMax) goto LAB_003043f9;
      }
    }
    if ((fVar61 == (float)local_b8._0_4_) && (!NAN(fVar61) && !NAN((float)local_b8._0_4_))) {
      if (((float)local_28._0_4_ == (float)local_38._0_4_) &&
         (!NAN((float)local_28._0_4_) && !NAN((float)local_38._0_4_))) goto LAB_00304394;
    }
    if ((float)local_38._0_4_ <= tMax) {
      auVar13._4_4_ =
           local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar13._0_4_ =
           local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar13._8_4_ =
           local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar13._12_4_ =
           local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar21 = vinsertps_avx(auVar13,ZEXT416((uint)local_d8.super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      fVar61 = ((float)local_b8._0_4_ + (float)local_38._0_4_) * 0.5;
      auVar24 = vinsertps_avx((undefined1  [16])
                              local_f8.super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                              ZEXT416((uint)local_f8.super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10)
      ;
      local_48 = ZEXT416((uint)fVar61);
      fVar59 = (local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                low + local_d8.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 +
               fVar61 * (local_f8.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                        local_f8.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      fVar83 = (local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high + auVar21._0_4_) * 0.5 +
               fVar61 * (local_f8.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high + auVar24._0_4_) * 0.5;
      fVar87 = (local_d8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                low + auVar21._4_4_) * 0.5 +
               fVar61 * (local_f8.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low + auVar24._4_4_) * 0.5;
      fVar88 = (auVar21._8_4_ + 0.0) * 0.5 + fVar61 * (auVar24._8_4_ + 0.0) * 0.5;
      fVar89 = (auVar21._12_4_ + 0.0) * 0.5 + fVar61 * (auVar24._12_4_ + 0.0) * 0.5;
      auVar82._0_4_ = fVar83 * fVar83;
      auVar82._4_4_ = fVar87 * fVar87;
      auVar82._8_4_ = fVar88 * fVar88;
      auVar82._12_4_ = fVar89 * fVar89;
      auVar21 = vhaddps_avx(auVar82,auVar82);
      auVar21 = ZEXT416((uint)(auVar21._0_4_ + fVar59 * fVar59));
      auVar21 = vsqrtss_avx(auVar21,auVar21);
      fVar61 = fVar60 / auVar21._0_4_;
      local_58._0_4_ = fVar83 * fVar61;
      local_58._4_4_ = fVar87 * fVar61;
      local_58._8_4_ = fVar88 * fVar61;
      local_58._12_4_ = fVar89 * fVar61;
      uVar1 = vcmpps_avx512vl(local_58,ZEXT416(0) << 0x20,0);
      auVar21 = vmovshdup_avx(local_58);
      uVar2 = vcmpps_avx512vl(auVar21,ZEXT416(0) << 0x20,0);
      if ((uVar1 & uVar2 & 1) != 0) {
        local_58._4_12_ = local_58._4_12_;
        local_58._0_4_ = fVar60 * 1e-05;
      }
      fVar59 = fVar59 * fVar61;
      auVar21 = vmovshdup_avx(local_58);
      auVar47._0_4_ = atan2f(auVar21._0_4_,local_58._0_4_);
      auVar47._4_60_ = extraout_var_04;
      auVar10._8_4_ = 0x80000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._12_4_ = 0x80000000;
      auVar21 = vxorps_avx512vl(ZEXT416((uint)this->radius),auVar10);
      if ((this->zMin <= auVar21._0_4_) || (this->zMin <= fVar59)) {
        uVar1 = vcmpps_avx512vl(ZEXT416((uint)this->zMax),ZEXT416((uint)this->radius),1);
        uVar2 = vcmpps_avx512vl(ZEXT416((uint)this->zMax),ZEXT416((uint)fVar59),1);
        if ((uVar1 & uVar2 & 1) == 0) {
          uVar3 = vcmpss_avx512f(auVar47._0_16_,ZEXT816(0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          fVar83 = (float)((uint)bVar4 * (int)(auVar47._0_4_ + 6.2831855) +
                          (uint)!bVar4 * (int)auVar47._0_4_);
          if (fVar83 <= this->phiMax) {
LAB_003043f9:
            __return_storage_ptr__->set = true;
            (__return_storage_ptr__->optionalValue).__align =
                 (anon_struct_4_0_00000001_for___align)local_48._0_4_;
            uVar3 = vmovlps_avx(local_58);
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 4) = uVar3;
            *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = fVar59;
            *(float *)((long)&__return_storage_ptr__->optionalValue + 0x10) = fVar83;
            return __return_storage_ptr__;
          }
        }
      }
    }
  }
LAB_00304394:
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        Float phi;
        Point3f pHit;
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Solve quadratic equation to compute sphere _t0_ and _t1_
        Interval t0, t1;
        // Compute sphere quadratic coefficients
        Interval a = SumSquares(di.x, di.y, di.z);
        Interval b = 2 * (di.x * oi.x + di.y * oi.y + di.z * oi.z);
        Interval c = SumSquares(oi.x, oi.y, oi.z) - Sqr(Interval(radius));

        // Compute sphere quadratic discriminant _discrim_
        Interval f = b / (2 * a);
        Point3fi fp = oi - f * di;
        Interval sqrtf = Sqrt(Sqr(fp.x) + Sqr(fp.y) + Sqr(fp.z));
        Interval discrim =
            4 * a * (Interval(radius) + sqrtf) * (Interval(radius) - sqrtf);
        if (discrim.LowerBound() < 0)
            return {};

        // Compute quadratic $t$ values
        Interval rootDiscrim = Sqrt(discrim);
        Interval q;
        if ((Float)b < 0)
            q = -.5f * (b - rootDiscrim);
        else
            q = -.5f * (b + rootDiscrim);
        t0 = q / a;
        t1 = c / q;
        // Swap quadratic $t$ values so that _t0_ is the lesser
        if (t0.LowerBound() > t1.LowerBound())
            pstd::swap(t0, t1);

        // Check quadric shape _t0_ and _t1_ for nearest intersection
        if (t0.UpperBound() > tMax || t1.LowerBound() <= 0)
            return {};
        Interval tShapeHit = t0;
        if (tShapeHit.LowerBound() <= 0) {
            tShapeHit = t1;
            if (tShapeHit.UpperBound() > tMax)
                return {};
        }

        // Compute sphere hit position and $\phi$
        pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        // Refine sphere intersection point
        pHit *= radius / Distance(pHit, Point3f(0, 0, 0));

        if (pHit.x == 0 && pHit.y == 0)
            pHit.x = 1e-5f * radius;
        phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;

        // Test sphere intersection against clipping parameters
        if ((zMin > -radius && pHit.z < zMin) || (zMax < radius && pHit.z > zMax) ||
            phi > phiMax) {
            if (tShapeHit == t1)
                return {};
            if (t1.UpperBound() > tMax)
                return {};
            tShapeHit = t1;
            // Compute sphere hit position and $\phi$
            pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
            // Refine sphere intersection point
            pHit *= radius / Distance(pHit, Point3f(0, 0, 0));

            if (pHit.x == 0 && pHit.y == 0)
                pHit.x = 1e-5f * radius;
            phi = std::atan2(pHit.y, pHit.x);
            if (phi < 0)
                phi += 2 * Pi;

            if ((zMin > -radius && pHit.z < zMin) || (zMax < radius && pHit.z > zMax) ||
                phi > phiMax)
                return {};
        }

        // Return _QuadricIntersection_ for sphere intersection
        return QuadricIntersection{Float(tShapeHit), pHit, phi};
    }